

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 17-syntax-catch.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  vector<lest::test,_std::allocator<lest::test>_> local_30;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_30,&specification);
  argv_local._4_4_ = lest::run(&local_30,(int)argv_local,local_18,(ostream *)&std::cout);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_30);
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char * argv[] )
{
    return lest::run( specification, argc, argv /*, std::cout */ );
}